

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O3

void Abc_NtkChangeCiOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vSupp,int fReverse)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = vSupp->nSize;
  if (uVar6 != pNtk->vCis->nSize) {
    __assert_fail("Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcOrder.c"
                  ,0x70,"void Abc_NtkChangeCiOrder(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  if (fReverse == 0) {
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        if ((long)pNtk->vCis->nSize <= (long)uVar7) goto LAB_002dd895;
        pNtk->vCis->pArray[uVar7] = vSupp->pArray[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  else if (0 < (int)uVar6) {
    lVar3 = (ulong)uVar6 << 3;
    lVar8 = 0;
    do {
      uVar6 = uVar6 - 1;
      if ((lVar3 == lVar8) || (pNtk->vCis->nSize <= (int)uVar6)) {
LAB_002dd895:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pNtk->vCis->pArray[uVar6] = *(void **)((long)vSupp->pArray + lVar8);
      lVar8 = lVar8 + 8;
    } while (lVar3 != lVar8);
  }
  pNtk->vPis->nSize = 0;
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar3];
      if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 2) {
        pVVar5 = pNtk->vPis;
        uVar6 = pVVar5->nSize;
        if (uVar6 == pVVar5->nCap) {
          if ((int)uVar6 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar4;
            pVVar5->nCap = 0x10;
          }
          else {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar6 << 4);
            }
            pVVar5->pArray = ppvVar4;
            pVVar5->nCap = uVar6 * 2;
          }
        }
        else {
          ppvVar4 = pVVar5->pArray;
        }
        iVar1 = pVVar5->nSize;
        pVVar5->nSize = iVar1 + 1;
        ppvVar4[iVar1] = pvVar2;
        pVVar5 = pNtk->vCis;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkChangeCiOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vSupp, int fReverse )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk) );
    // order CIs using the array
    if ( fReverse )
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, Vec_PtrSize(vSupp)-1-i, pObj );
    else
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, i, pObj );
    // order PIs accordingly
    Vec_PtrClear( pNtk->vPis );
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjIsPi(pObj) )
            Vec_PtrPush( pNtk->vPis, pObj );
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        printf( "%s ", Abc_ObjName(pObj) );
//    printf( "\n" );
}